

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::CompressionParameters>::setCapacity
          (Vector<kj::CompressionParameters> *this,size_t newSize)

{
  bool bVar1;
  RemoveConst<kj::CompressionParameters> *pRVar2;
  CompressionParameters *pCVar3;
  CompressionParameters *pCVar4;
  ulong uVar5;
  ArrayBuilder<kj::CompressionParameters> local_38;
  
  pCVar4 = (this->builder).ptr;
  pCVar3 = (this->builder).pos;
  uVar5 = ((long)pCVar3 - (long)pCVar4 >> 3) * -0x3333333333333333;
  if ((newSize <= uVar5 && uVar5 - newSize != 0) && (pCVar4 = pCVar4 + newSize, pCVar4 < pCVar3)) {
    do {
      pCVar3 = pCVar3 + -1;
    } while (pCVar4 < pCVar3);
    (this->builder).pos = pCVar3;
  }
  local_38.ptr = (CompressionParameters *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x28,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pCVar3 = (this->builder).pos;
  local_38.pos = local_38.ptr;
  for (pCVar4 = (this->builder).ptr; pCVar4 != pCVar3; pCVar4 = pCVar4 + 1) {
    bVar1 = pCVar4->inboundNoContextTakeover;
    (local_38.pos)->outboundNoContextTakeover = pCVar4->outboundNoContextTakeover;
    (local_38.pos)->inboundNoContextTakeover = bVar1;
    bVar1 = (pCVar4->outboundMaxWindowBits).ptr.isSet;
    ((local_38.pos)->outboundMaxWindowBits).ptr.isSet = bVar1;
    if (bVar1 == true) {
      ((local_38.pos)->outboundMaxWindowBits).ptr.field_1 =
           (pCVar4->outboundMaxWindowBits).ptr.field_1;
      (pCVar4->outboundMaxWindowBits).ptr.isSet = false;
    }
    bVar1 = (pCVar4->inboundMaxWindowBits).ptr.isSet;
    ((local_38.pos)->inboundMaxWindowBits).ptr.isSet = bVar1;
    if (bVar1 == true) {
      ((local_38.pos)->inboundMaxWindowBits).ptr.field_1 =
           (pCVar4->inboundMaxWindowBits).ptr.field_1;
      (pCVar4->inboundMaxWindowBits).ptr.isSet = false;
    }
    local_38.pos = local_38.pos + 1;
  }
  ArrayBuilder<kj::CompressionParameters>::operator=(&this->builder,&local_38);
  pCVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pCVar4 = local_38.ptr;
  if (local_38.ptr != (CompressionParameters *)0x0) {
    local_38.ptr = (CompressionParameters *)0x0;
    local_38.pos = (RemoveConst<kj::CompressionParameters> *)0x0;
    local_38.endPtr = (CompressionParameters *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pCVar4,0x28,
               ((long)pRVar2 - (long)pCVar4 >> 3) * -0x3333333333333333,
               ((long)pCVar3 - (long)pCVar4 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::CompressionParameters>::destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }